

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.cpp
# Opt level: O1

string * __thiscall
duckdb::Bit::BlobToBit_abi_cxx11_(string *__return_storage_ptr__,Bit *this,string_t blob)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  uint uVar3;
  ulong uVar4;
  void *__src;
  undefined4 *__dest;
  bitstring_t output_str;
  undefined4 local_54;
  undefined4 uStack_50;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined8 local_40;
  void *local_38;
  
  uVar4 = ((ulong)this & 0xffffffff) + 1;
  local_48 = (undefined4 *)operator_new__(uVar4);
  __dest = &local_54;
  uVar3 = (uint)uVar4;
  if (uVar3 < 0xd) {
    local_4c = 0;
    local_54 = 0;
    uStack_50 = 0;
    if (uVar3 != 0) {
      switchD_00b1422a::default(__dest,local_48,(ulong)(uVar3 & 0xf));
    }
  }
  else {
    local_54 = *local_48;
    uStack_50 = SUB84(local_48,0);
    local_4c = (undefined4)((ulong)local_48 >> 0x20);
  }
  __src = blob.value._0_8_;
  if (((ulong)this & 0xffffffff) < 0xd) {
    __src = (void *)((long)&local_40 + 4);
  }
  puVar1 = (undefined4 *)CONCAT44(local_4c,uStack_50);
  puVar2 = puVar1;
  if (uVar3 < 0xd) {
    puVar2 = __dest;
  }
  local_40 = this;
  local_38 = blob.value._0_8_;
  *(undefined1 *)puVar2 = 0;
  if (uVar3 < 0xd) {
    puVar1 = &local_54;
  }
  switchD_00b1422a::default((undefined1 *)((long)puVar1 + 1),__src,(ulong)this & 0xffffffff);
  puVar1 = local_48;
  if (0xc < (uVar4 & 0xffffffff)) {
    __dest = (undefined4 *)CONCAT44(local_4c,uStack_50);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,__dest,
             (undefined1 *)((uVar4 & 0xffffffff) + (long)__dest));
  operator_delete__(puVar1);
  return __return_storage_ptr__;
}

Assistant:

string Bit::BlobToBit(string_t blob) {
	auto buffer = make_unsafe_uniq_array_uninitialized<char>(blob.GetSize() + 1);
	bitstring_t output_str(buffer.get(), UnsafeNumericCast<uint32_t>(blob.GetSize() + 1));
	Bit::BlobToBit(blob, output_str);
	return output_str.GetString();
}